

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O0

int __thiscall
btGeneric6DofSpring2Constraint::setLinearLimits
          (btGeneric6DofSpring2Constraint *this,btConstraintInfo2 *info,int row,btTransform *transA,
          btTransform *transB,btVector3 *linVelA,btVector3 *linVelB,btVector3 *angVelA,
          btVector3 *angVelB)

{
  uint uVar1;
  btScalar *pbVar2;
  int in_EDX;
  btTransform *unaff_RBX;
  btVector3 *in_RSI;
  btTransform *in_RDI;
  btRotationalLimitMotor2 *unaff_R14;
  btGeneric6DofSpring2Constraint *unaff_R15;
  btVector3 *unaff_retaddr;
  btVector3 *in_stack_00000008;
  btConstraintInfo2 *in_stack_00000010;
  int in_stack_00000018;
  btVector3 *in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  bool indx2Violated;
  bool indx1Violated;
  int rotAllowed;
  int indx2;
  int indx1;
  int flags;
  btVector3 axis;
  int i;
  btRotationalLimitMotor2 limot;
  btVector3 *in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  btScalar local_f0;
  btScalar local_ec;
  btScalar local_e8;
  btScalar local_e4;
  int local_ac;
  btRotationalLimitMotor2 local_a8;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar3;
  btTransform *transB_00;
  
  transB_00 = in_RDI;
  btRotationalLimitMotor2::btRotationalLimitMotor2(&local_a8);
  for (local_ac = 0; iVar3 = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20), local_ac < 3;
      local_ac = local_ac + 1) {
    if (((in_RDI[0xf].m_origin.m_floats[(long)local_ac + -7] != 0.0) ||
        ((*(byte *)((long)in_RDI[0xc].m_origin.m_floats + (long)local_ac) & 1) != 0)) ||
       ((*(byte *)((long)in_RDI[0xc].m_origin.m_floats + (long)local_ac + 6) & 1) != 0)) {
      pbVar2 = btVector3::operator_cast_to_float_(in_RDI[0xb].m_basis.m_el + 2);
      local_a8.m_bounce = pbVar2[local_ac];
      local_a8.m_currentLimit = (int)in_RDI[0xf].m_origin.m_floats[(long)local_ac + -7];
      pbVar2 = btVector3::operator_cast_to_float_
                         ((btVector3 *)(in_RDI[0xf].m_basis.m_el[0].m_floats + 1));
      local_a8.m_currentPosition = pbVar2[local_ac];
      pbVar2 = btVector3::operator_cast_to_float_
                         ((btVector3 *)(in_RDI[0xe].m_basis.m_el[2].m_floats + 1));
      local_a8.m_currentLimitError = pbVar2[local_ac];
      pbVar2 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI[0xe].m_origin.m_floats + 1));
      local_a8.m_currentLimitErrorHi = pbVar2[local_ac];
      local_a8.m_enableMotor =
           (bool)(*(byte *)((long)in_RDI[0xc].m_origin.m_floats + (long)local_ac) & 1);
      local_a8.m_servoMotor =
           (bool)(*(byte *)((long)in_RDI[0xc].m_origin.m_floats + (long)local_ac + 3) & 1);
      pbVar2 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI[0xc].m_origin.m_floats + 3));
      local_a8.m_servoTarget = pbVar2[local_ac];
      local_a8.m_enableSpring =
           (bool)(*(byte *)((long)in_RDI[0xc].m_origin.m_floats + (long)local_ac + 6) & 1);
      pbVar2 = btVector3::operator_cast_to_float_
                         ((btVector3 *)(in_RDI[0xd].m_basis.m_el[0].m_floats + 3));
      local_a8.m_springStiffness = pbVar2[local_ac];
      local_a8.m_springStiffnessLimited =
           (bool)(*(byte *)((long)in_RDI[0xd].m_basis.m_el[1].m_floats + (long)local_ac + 0xc) & 1);
      pbVar2 = btVector3::operator_cast_to_float_(in_RDI[0xd].m_basis.m_el + 2);
      local_a8.m_springDamping = pbVar2[local_ac];
      local_a8.m_springDampingLimited =
           (bool)(*(byte *)((long)in_RDI[0xd].m_origin.m_floats + (long)local_ac) & 1);
      pbVar2 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI[0xd].m_origin.m_floats + 1));
      local_a8.m_equilibriumPoint = pbVar2[local_ac];
      pbVar2 = btVector3::operator_cast_to_float_(in_RDI[0xb].m_basis.m_el + 1);
      local_a8.m_hiLimit = pbVar2[local_ac];
      pbVar2 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xb));
      local_a8.m_loLimit = pbVar2[local_ac];
      pbVar2 = btVector3::operator_cast_to_float_
                         ((btVector3 *)(in_RDI[0xe].m_basis.m_el[1].m_floats + 1));
      local_a8.m_maxMotorForce = pbVar2[local_ac];
      pbVar2 = btVector3::operator_cast_to_float_
                         ((btVector3 *)(in_RDI[0xe].m_basis.m_el[0].m_floats + 1));
      local_a8.m_targetVelocity = pbVar2[local_ac];
      btTransform::getBasis((btTransform *)(in_RDI[0x13].m_basis.m_el[2].m_floats + 3));
      btMatrix3x3::getColumn
                ((btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),iVar3)
      ;
      uVar1 = (int)in_RDI[0x17].m_basis.m_el[0].m_floats[2] >> ((byte)(local_ac << 2) & 0x1f);
      if ((uVar1 & 1) == 0) {
        local_e4 = **(btScalar **)(in_RSI[3].m_floats + 2);
        in_stack_fffffffffffffee0 = in_EDX;
        in_stack_fffffffffffffed8 = in_RSI;
      }
      else {
        pbVar2 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0xc));
        local_e4 = pbVar2[local_ac];
        in_stack_fffffffffffffee0 = in_EDX;
        in_stack_fffffffffffffed8 = in_RSI;
      }
      local_a8.m_stopCFM = local_e4;
      if ((uVar1 & 2) == 0) {
        local_e8 = in_stack_fffffffffffffed8->m_floats[1];
      }
      else {
        pbVar2 = btVector3::operator_cast_to_float_(&in_RDI[0xb].m_origin);
        local_e8 = pbVar2[local_ac];
      }
      local_a8.m_stopERP = local_e8;
      if ((uVar1 & 4) == 0) {
        local_ec = **(btScalar **)(in_stack_fffffffffffffed8[3].m_floats + 2);
      }
      else {
        pbVar2 = btVector3::operator_cast_to_float_(in_RDI[0xc].m_basis.m_el + 2);
        local_ec = pbVar2[local_ac];
      }
      local_a8.m_motorCFM = local_ec;
      if ((uVar1 & 8) == 0) {
        local_f0 = in_stack_fffffffffffffed8->m_floats[1];
      }
      else {
        pbVar2 = btVector3::operator_cast_to_float_(in_RDI[0xc].m_basis.m_el + 1);
        local_f0 = pbVar2[local_ac];
      }
      local_a8.m_motorERP = local_f0;
      iVar3 = in_stack_fffffffffffffee0;
      in_RSI = in_stack_fffffffffffffed8;
      in_EDX = get_limit_motor_info2
                         (unaff_R15,unaff_R14,unaff_RBX,transB_00,in_stack_fffffffffffffed8,
                          (btVector3 *)CONCAT44(in_stack_fffffffffffffee0,in_stack_ffffffffffffffc8)
                          ,unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018,
                          in_stack_00000020,in_stack_00000028,in_stack_00000030);
      in_EDX = in_EDX + iVar3;
    }
  }
  return in_EDX;
}

Assistant:

int btGeneric6DofSpring2Constraint::setLinearLimits(btConstraintInfo2* info, int row, const btTransform& transA,const btTransform& transB,const btVector3& linVelA,const btVector3& linVelB,const btVector3& angVelA,const btVector3& angVelB)
{
	//solve linear limits
	btRotationalLimitMotor2 limot;
	for (int i=0;i<3 ;i++ )
	{
		if(m_linearLimits.m_currentLimit[i] || m_linearLimits.m_enableMotor[i] || m_linearLimits.m_enableSpring[i])
		{ // re-use rotational motor code
			limot.m_bounce                 = m_linearLimits.m_bounce[i];
			limot.m_currentLimit           = m_linearLimits.m_currentLimit[i];
			limot.m_currentPosition        = m_linearLimits.m_currentLinearDiff[i];
			limot.m_currentLimitError      = m_linearLimits.m_currentLimitError[i];
			limot.m_currentLimitErrorHi    = m_linearLimits.m_currentLimitErrorHi[i];
			limot.m_enableMotor            = m_linearLimits.m_enableMotor[i];
			limot.m_servoMotor             = m_linearLimits.m_servoMotor[i];
			limot.m_servoTarget            = m_linearLimits.m_servoTarget[i];
			limot.m_enableSpring           = m_linearLimits.m_enableSpring[i];
			limot.m_springStiffness        = m_linearLimits.m_springStiffness[i];
			limot.m_springStiffnessLimited = m_linearLimits.m_springStiffnessLimited[i];
			limot.m_springDamping          = m_linearLimits.m_springDamping[i];
			limot.m_springDampingLimited   = m_linearLimits.m_springDampingLimited[i];
			limot.m_equilibriumPoint       = m_linearLimits.m_equilibriumPoint[i];
			limot.m_hiLimit                = m_linearLimits.m_upperLimit[i];
			limot.m_loLimit                = m_linearLimits.m_lowerLimit[i];
			limot.m_maxMotorForce          = m_linearLimits.m_maxMotorForce[i];
			limot.m_targetVelocity         = m_linearLimits.m_targetVelocity[i];
			btVector3 axis = m_calculatedTransformA.getBasis().getColumn(i);
			int flags = m_flags >> (i * BT_6DOF_FLAGS_AXIS_SHIFT2);
			limot.m_stopCFM  = (flags & BT_6DOF_FLAGS_CFM_STOP2) ? m_linearLimits.m_stopCFM[i] : info->cfm[0];
			limot.m_stopERP  = (flags & BT_6DOF_FLAGS_ERP_STOP2) ? m_linearLimits.m_stopERP[i] : info->erp;
			limot.m_motorCFM = (flags & BT_6DOF_FLAGS_CFM_MOTO2) ? m_linearLimits.m_motorCFM[i] : info->cfm[0];
			limot.m_motorERP = (flags & BT_6DOF_FLAGS_ERP_MOTO2) ? m_linearLimits.m_motorERP[i] : info->erp;

			//rotAllowed is a bit of a magic from the original 6dof. The calculation of it here is something that imitates the original behavior as much as possible.
			int indx1 = (i + 1) % 3;
			int indx2 = (i + 2) % 3;
			int rotAllowed = 1; // rotations around orthos to current axis (it is used only when one of the body is static)
			#define D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION 1.0e-3
			bool indx1Violated = m_angularLimits[indx1].m_currentLimit == 1 ||
				m_angularLimits[indx1].m_currentLimit == 2 ||
				( m_angularLimits[indx1].m_currentLimit == 3 && ( m_angularLimits[indx1].m_currentLimitError < -D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION || m_angularLimits[indx1].m_currentLimitError > D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION ) ) ||
				( m_angularLimits[indx1].m_currentLimit == 4 && ( m_angularLimits[indx1].m_currentLimitError < -D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION || m_angularLimits[indx1].m_currentLimitErrorHi > D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION ) );
			bool indx2Violated = m_angularLimits[indx2].m_currentLimit == 1 ||
				m_angularLimits[indx2].m_currentLimit == 2 ||
				( m_angularLimits[indx2].m_currentLimit == 3 && ( m_angularLimits[indx2].m_currentLimitError < -D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION || m_angularLimits[indx2].m_currentLimitError > D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION ) ) ||
				( m_angularLimits[indx2].m_currentLimit == 4 && ( m_angularLimits[indx2].m_currentLimitError < -D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION || m_angularLimits[indx2].m_currentLimitErrorHi > D6_LIMIT_ERROR_THRESHOLD_FOR_ROTATION ) );
			if( indx1Violated && indx2Violated )
			{
				rotAllowed = 0;
			}
			row += get_limit_motor_info2(&limot, transA,transB,linVelA,linVelB,angVelA,angVelB, info, row, axis, 0, rotAllowed);

		}
	}
	return row;
}